

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_gravity.c
# Opt level: O2

void fsnav_ins_gravity_constant(void)

{
  char *__nptr;
  fsnav_imu *pfVar1;
  long lVar2;
  double dVar3;
  char t0_token [10];
  
  builtin_strncpy(t0_token,"alignment",10);
  pfVar1 = fsnav->imu;
  if (pfVar1 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_gravity_constant::n = 0;
      fsnav_ins_gravity_constant::t0 = -1.0;
      for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
        *(undefined8 *)((long)fsnav_ins_gravity_constant::f + lVar2) = 0;
      }
      __nptr = fsnav_locate_token(t0_token,pfVar1->cfg,pfVar1->cfglength,'=');
      if ((__nptr != (char *)0x0) &&
         (fsnav_ins_gravity_constant::t0 = atof(__nptr), 0.0 < fsnav_ins_gravity_constant::t0)) {
        return;
      }
      fsnav_ins_gravity_constant::t0 = 60.0;
    }
    else if (-1 < fsnav->mode) {
      pfVar1->g_valid = '\0';
      if ((pfVar1->t <= fsnav_ins_gravity_constant::t0) && (pfVar1->f_valid != '\0')) {
        fsnav_ins_gravity_constant::n = fsnav_ins_gravity_constant::n + 1;
        dVar3 = (double)fsnav_ins_gravity_constant::n;
        for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
          *(double *)((long)fsnav_ins_gravity_constant::f + lVar2) =
               *(double *)((long)fsnav_ins_gravity_constant::f + lVar2) * ((dVar3 + -1.0) / dVar3) +
               *(double *)((long)pfVar1->f + lVar2) / dVar3;
        }
        dVar3 = fsnav_linal_vnorm(fsnav_ins_gravity_constant::f,3);
        fsnav_ins_gravity_constant::g3 = -dVar3;
        pfVar1 = fsnav->imu;
      }
      pfVar1->g[0] = 0.0;
      pfVar1->g[1] = 0.0;
      pfVar1->g[2] = fsnav_ins_gravity_constant::g3;
      pfVar1->g_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_gravity_constant(void) {

	const char   t0_token[] = "alignment"; // alignment duration parameter name in configuration
	const double t0_default = 60;          // default alignment duration

	static double
		f[3] = {0,0,0}, // average specific force vector measured by accelerometers
		g3   =  0,      // its norm
		t0   = -1;      // imu initial alignment duration
	static long n = 0;  // number of measurements used so far

	char   *cfg_ptr;    // pointer to a substring in configuration
	double  n1_n;       // (n - 1)/n
	size_t  i;          // index


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// initial values
		n  =  0;
		t0 = -1;
		// zero average specific force
		for (i = 0; i < 3; i++)
			f[i] = 0;
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;

	}
	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}

	else						// main cycle
	{
		// validity flag down
		fsnav->imu->g_valid = 0;

		if (fsnav->imu->t <= t0 && fsnav->imu->f_valid) { // while alignment goes on, and accelerometer measurements are available
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++)
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n; // averaging components
			g3 = -fsnav_linal_vnorm(f,3);                   // renew magnitude, negative
		}
		// zero Eastern and Northern components
		fsnav->imu->g[0] = 0;
		fsnav->imu->g[1] = 0;
		// vertical component, negative magnitude of average measured specific force vector
		fsnav->imu->g[2] = g3;
		// validity flag up
		fsnav->imu->g_valid = 1;
	}

}